

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  RtreeNode *pRVar1;
  int iCell_00;
  int iVar2;
  RtreeNode *pNode_00;
  ulong uVar3;
  RtreeNode *p;
  int iVar4;
  RtreeNode *pParent;
  int iCell;
  RtreeCell cell;
  int local_64;
  RtreeCell local_60;
  
  if (pNode->pParent == (RtreeNode *)0x0) {
    return 0;
  }
  iVar4 = 0;
  pRVar1 = pNode->pParent;
  do {
    pNode_00 = pRVar1;
    if (iVar4 == 1000) {
      return 0x10b;
    }
    pRVar1 = (RtreeNode *)pNode_00->zData;
    iVar2 = nodeRowidIndex(pRtree,pRVar1,pNode->iNode,&local_64);
    iCell_00 = local_64;
    if (iVar2 != 0) {
      return 0x10b;
    }
    nodeGetCell(pRtree,pRVar1,local_64,&local_60);
    if ((ulong)pRtree->nDim2 != 0) {
      uVar3 = 0;
      do {
        if (pRtree->eCoordType == '\x01') {
          if ((pCell->aCoord[uVar3].i < local_60.aCoord[uVar3].i) ||
             (local_60.aCoord[uVar3 + 1].i < pCell->aCoord[uVar3 + 1].i)) goto LAB_001cdecb;
        }
        else if ((pCell->aCoord[uVar3].f <= local_60.aCoord[uVar3].f &&
                  local_60.aCoord[uVar3].f != pCell->aCoord[uVar3].f) ||
                (local_60.aCoord[uVar3 + 1].f <= pCell->aCoord[uVar3 + 1].f &&
                 pCell->aCoord[uVar3 + 1].f != local_60.aCoord[uVar3 + 1].f)) {
LAB_001cdecb:
          cellUnion(pRtree,&local_60,pCell);
          nodeOverwriteCell(pRtree,pNode_00,&local_60,iCell_00);
          break;
        }
        uVar3 = uVar3 + 2;
      } while (uVar3 < pRtree->nDim2);
    }
    iVar4 = iVar4 + 1;
    pRVar1 = pNode_00->pParent;
    pNode = pNode_00;
    if (pNode_00->pParent == (RtreeNode *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  int cnt = 0;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    if( (++cnt)>1000 || nodeParentIndex(pRtree, p, &iCell)  ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }
 
    p = pParent;
  }
  return SQLITE_OK;
}